

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-time.c
# Opt level: O2

int dmy_to_mjd2000(int D,int M,int Y,int *mjd2000)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int local_38;
  int transition;
  
  iVar1 = dmy_to_mjd2000_julian(D,M,Y,&local_38);
  iVar3 = -1;
  if (iVar1 != 0) {
    return -1;
  }
  iVar1 = dmy_to_mjd2000_julian(2,9,0x6d8,&transition);
  if (iVar1 != 0) {
    return -1;
  }
  if (transition < local_38) {
    if (((0 < D) && (Y != 0)) && (0xfffffff3 < M - 0xdU)) {
      uVar2 = 0;
      if (M == 2) {
        uVar2 = Y - (Y >> 0x1f);
        uVar2 = (uint)(((int)uVar2 % 400 == 0) != (((int)uVar2 % 100 == 0) != ((uVar2 & 3) == 0)));
      }
      if (D <= (int)((*(int *)(&DAT_001a8940 + (ulong)(uint)M * 4) -
                     *(int *)(&DAT_001a8940 + (ulong)(M - 1) * 4)) + uVar2)) {
        uVar2 = Y - (Y >> 0x1f);
        local_38 = 0;
        if ((uint)M < 3) {
          local_38 = -(uint)((uint)((uVar2 & 3) == 0) - (uint)((int)uVar2 % 100 == 0) !=
                            -(uint)((int)uVar2 % 400 == 0));
        }
        local_38 = local_38 +
                   ((uVar2 * 0x16d + ((int)uVar2 % 400 >> 0x1f)) - ((int)uVar2 % 100 >> 0x1f)) +
                   ((int)uVar2 % 4 >> 0x1f) + *(int *)(&DAT_001a8940 + (ulong)(M - 1) * 4) +
                   (int)uVar2 / -100 + (int)uVar2 / 4 + (int)uVar2 / 400 + D;
        if (transition + -0x231ac3 < local_38 + -0x8d7df) {
          local_38 = local_38 + -0xb2575;
          goto LAB_001590ff;
        }
      }
    }
    coda_set_error(-0x68,"invalid date/time argument (%02d-%02d-%04d)",(ulong)(uint)D,(ulong)(uint)M
                   ,(ulong)(uint)Y);
  }
  else {
    local_38 = local_38 + -0x256859;
LAB_001590ff:
    *mjd2000 = local_38;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int dmy_to_mjd2000(int D, int M, int Y, int *mjd2000)
{
    const int TD = 2;
    const int TM = 9;
    const int TY = 1752;
    int transition;
    int the_date;

    if (dmy_to_mjd2000_julian(D, M, Y, &the_date) != 0 || dmy_to_mjd2000_julian(TD, TM, TY, &transition) != 0)
    {
        return -1;
    }

    if (the_date <= transition)
    {
        /* Julian calendar regime */
        *mjd2000 = the_date - 2451545;
    }
    else
    {
        /* Gregorian calendar regime */
        if (dmy_to_mjd2000_gregorian(D, M, Y, &the_date) != 0)
        {
            return -1;
        }

        if (the_date - 150934 <= transition - 2451545)
        {
            coda_set_error(CODA_ERROR_INVALID_DATETIME, "invalid date/time argument (%02d-%02d-%04d)", D, M, Y);
            return -1;
        }

        *mjd2000 = the_date - 150934;
    }

    return 0;
}